

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

bool __thiscall
tetgenmesh::fillcavity
          (tetgenmesh *this,arraypool *topshells,arraypool *botshells,arraypool *midfaces,
          arraypool *missingshs,arraypool *topnewtets,arraypool *botnewtets,triface *crossedge)

{
  tetrahedron *pppdVar1;
  triface *t;
  tetrahedron ppdVar2;
  tetrahedron C;
  char *pcVar3;
  memorypool *pmVar4;
  shellface ppdVar5;
  undefined8 *puVar6;
  int iVar7;
  unsigned_long uVar8;
  shellface ppdVar9;
  tetrahedron *pppdVar10;
  int *piVar11;
  shellface *pppdVar12;
  long lVar13;
  bool bVar14;
  uint uVar15;
  uint uVar16;
  uint *puVar17;
  long lVar18;
  int iVar19;
  tetrahedron ppdVar20;
  ulong uVar21;
  shellface *pppdVar22;
  arraypool *paVar23;
  long lVar24;
  tetrahedron ppdVar25;
  long lVar26;
  arraypool *paVar27;
  tetrahedron B;
  double dVar28;
  triface local_110;
  triface local_100;
  face newsh;
  triface local_c8;
  triface local_b8;
  arraypool *local_a8;
  arraypool *local_a0;
  arraypool *local_98;
  arraypool *local_90;
  long local_88;
  face local_80;
  tetrahedron local_70;
  triface *parytet;
  triface bdrytet;
  int types [2];
  int poss [4];
  
  bdrytet.tet = (tetrahedron *)0x0;
  bdrytet.ver = 0;
  local_b8.tet = (tetrahedron *)0x0;
  local_b8.ver = 0;
  local_c8.tet = (tetrahedron *)0x0;
  local_c8.ver = 0;
  local_a8 = missingshs;
  local_a0 = topnewtets;
  local_98 = topshells;
  local_90 = botshells;
  for (iVar7 = 0; iVar7 != 2; iVar7 = iVar7 + 1) {
    paVar23 = local_90;
    if (iVar7 == 0) {
      paVar23 = local_98;
    }
    if (paVar23 != (arraypool *)0x0) {
      for (lVar24 = 0; lVar24 < paVar23->objects; lVar24 = lVar24 + 1) {
        lVar13 = (long)paVar23->objectbytes *
                 (long)(int)(paVar23->objectsperblockmark & (uint)lVar24);
        uVar21 = **(ulong **)
                   (paVar23->toparray[(uint)lVar24 >> ((byte)paVar23->log2objectsperblock & 0x1f)] +
                   lVar13);
        bdrytet.ver = (uint)uVar21 & 0xf;
        bdrytet.tet = (tetrahedron *)(uVar21 & 0xfffffffffffffff0);
        uVar21 = (ulong)(uint)(bdrytet.ver << 2);
        ppdVar20 = bdrytet.tet[*(int *)((long)orgpivot + uVar21)];
        ppdVar2 = bdrytet.tet[*(int *)((long)destpivot + uVar21)];
        ppdVar25 = bdrytet.tet[*(int *)((long)apexpivot + uVar21)];
        stpivot(this,(face *)(paVar23->toparray
                              [(uint)lVar24 >> ((byte)paVar23->log2objectsperblock & 0x1f)] + lVar13
                             ),&local_b8);
        puVar17 = (uint *)((long)local_b8.tet + (long)this->elemmarkerindex * 4);
        *puVar17 = *puVar17 | 1;
        bond(this,&bdrytet,&local_b8);
        if (local_b8.tet[9] != (tetrahedron)0x0) {
          local_b8.tet[9][local_b8.ver & 3] = (double *)0x0;
        }
        iVar19 = this->point2simindex;
        ppdVar20[iVar19] = (double *)local_b8.tet;
        ppdVar2[iVar19] = (double *)local_b8.tet;
        ppdVar25[iVar19] = (double *)local_b8.tet;
      }
    }
  }
  if (crossedge == (triface *)0x0) {
    bVar14 = true;
  }
  else {
    local_110.tet = (tetrahedron *)0x0;
    local_110.ver = 0;
    local_100.tet = (tetrahedron *)0x0;
    local_100.ver = 0;
    ppdVar20 = crossedge->tet[orgpivot[crossedge->ver]];
    ppdVar2 = crossedge->tet[destpivot[crossedge->ver]];
    lVar24 = 0;
    bVar14 = false;
    local_70 = ppdVar20;
    while ((paVar23 = local_a8, lVar24 < local_a0->objects && (!bVar14))) {
      local_c8.tet = *(tetrahedron **)
                      (local_a0->toparray
                       [(uint)lVar24 >> ((byte)local_a0->log2objectsperblock & 0x1f)] +
                      (long)local_a0->objectbytes *
                      (long)(int)(local_a0->objectsperblockmark & (uint)lVar24));
      local_c8.ver = 0;
      local_88 = lVar24;
      while ((local_c8.ver < 4 && (!bVar14))) {
        ppdVar25 = local_c8.tet[orgpivot[local_c8.ver]];
        lVar24 = (long)this->pointmarkindex;
        if (((*(byte *)((long)ppdVar25 + lVar24 * 4 + 4) & 2) != 0) &&
           (((B = local_c8.tet[destpivot[local_c8.ver]],
             (*(byte *)((long)B + lVar24 * 4 + 4) & 2) != 0 &&
             (C = local_c8.tet[apexpivot[local_c8.ver]],
             (*(byte *)((long)C + lVar24 * 4 + 4) & 2) != 0)) &&
            (iVar7 = tri_edge_test(this,(point)ppdVar25,(point)B,(point)C,(point)ppdVar20,
                                   (point)ppdVar2,(point)0x0,1,types,poss), iVar7 == 2)))) {
          local_110.tet = local_c8.tet;
          local_110.ver = local_c8.ver;
          dVar28 = orient3d((double *)ppdVar25,(double *)B,(double *)C,(double *)ppdVar20);
          if (0.0 <= dVar28) {
            if ((dVar28 == 0.0) && (!NAN(dVar28))) {
              terminatetetgen(this,2);
            }
          }
          else {
            pppdVar10 = local_110.tet + (local_110.ver & 3);
            local_110.tet = (tetrahedron *)((ulong)*pppdVar10 & 0xfffffffffffffff0);
            local_110.ver = fsymtbl[local_110.ver][(uint)*pppdVar10 & 0xf];
            ppdVar25 = local_110.tet[orgpivot[local_110.ver]];
            B = local_110.tet[destpivot[local_110.ver]];
          }
          lVar24 = botnewtets->objects;
          if (lVar24 < 1) {
            lVar24 = 0;
          }
          for (lVar13 = 0; ppdVar20 = local_70, lVar24 != lVar13; lVar13 = lVar13 + 1) {
            lVar18 = (long)botnewtets->objectbytes *
                     (long)(int)(botnewtets->objectsperblockmark & (uint)lVar13);
            local_b8.tet = *(tetrahedron **)
                            (botnewtets->toparray
                             [(uint)lVar13 >> ((byte)botnewtets->log2objectsperblock & 0x1f)] +
                            lVar18);
            local_b8.ver = *(int *)(botnewtets->toparray
                                    [(uint)lVar13 >> ((byte)botnewtets->log2objectsperblock & 0x1f)]
                                   + lVar18 + 8);
            uVar15 = 0xb;
            if (((local_b8.tet[4] == B) || (uVar15 = 3, local_b8.tet[5] == B)) ||
               (uVar15 = 7, local_b8.tet[6] == B)) {
LAB_0012fe74:
              local_b8.ver = uVar15;
              if (local_b8.tet[destpivot[(uint)local_b8.ver]] != ppdVar25) {
                if (local_b8.tet[apexpivot[(uint)local_b8.ver]] == ppdVar25) {
                  puVar17 = (uint *)(eprevesymtbl + (uint)local_b8.ver);
                }
                else {
                  if (local_b8.tet[oppopivot[(uint)local_b8.ver]] != ppdVar25) goto LAB_0012fece;
                  puVar17 = (uint *)(enexttbl + esymtbl[(uint)local_b8.ver]);
                }
                local_b8.ver = *puVar17;
              }
              if (local_b8.tet[apexpivot[local_b8.ver]] == C) {
                bVar14 = true;
                local_100.tet = local_b8.tet;
                local_100.ver = local_b8.ver;
                break;
              }
            }
            else if (local_b8.tet[7] == B) {
              uVar15 = 0;
              goto LAB_0012fe74;
            }
LAB_0012fece:
          }
        }
        local_c8.ver = local_c8.ver + 1;
      }
      lVar24 = local_88 + 1;
    }
    if (bVar14) {
      bond(this,&local_110,&local_100);
      puVar17 = (uint *)((long)local_110.tet + (long)this->elemmarkerindex * 4);
      *puVar17 = *puVar17 | 1;
      puVar17 = (uint *)((long)local_100.tet + (long)this->elemmarkerindex * 4);
      *puVar17 = *puVar17 | 1;
      puVar17 = (uint *)((long)local_110.tet + (long)this->elemmarkerindex * 4);
      *puVar17 = *puVar17 | 4 << ((byte)local_110.ver & 3);
      arraypool::newindex(midfaces,&parytet);
      parytet->tet = local_110.tet;
      parytet->ver = local_110.ver;
    }
    else {
      local_110.tet = (tetrahedron *)0x0;
      uVar8 = randomnation(this,(int)local_a8->objects - 1);
      pcVar3 = paVar23->toparray[(int)(uint)uVar8 >> ((byte)paVar23->log2objectsperblock & 0x1f)];
      lVar24 = (long)paVar23->objectbytes * (long)(int)((uint)uVar8 & paVar23->objectsperblockmark);
      (this->recentsh).sh = *(shellface **)(pcVar3 + lVar24);
      (this->recentsh).shver = *(int *)(pcVar3 + lVar24 + 8);
    }
    lVar24 = 0;
    while ((paVar27 = local_90, paVar23 = local_98, lVar24 < midfaces->objects && (bVar14))) {
      pcVar3 = midfaces->toparray[(uint)lVar24 >> ((byte)midfaces->log2objectsperblock & 0x1f)];
      lVar13 = (long)midfaces->objectbytes *
               (long)(int)(midfaces->objectsperblockmark & (uint)lVar24);
      uVar15 = 0;
LAB_00130049:
      if ((uVar15 < 3) && (bVar14 != false)) {
        local_110.tet = *(tetrahedron **)(pcVar3 + lVar13);
        local_110.ver = *(int *)(pcVar3 + lVar13 + 8);
        lVar18 = (long)this->elemmarkerindex;
        do {
          local_110.ver = esymtbl[local_110.ver];
          ppdVar20 = local_110.tet[apexpivot[local_110.ver]];
          if ((*(byte *)((long)ppdVar20 + (long)this->pointmarkindex * 4 + 4) & 2) != 0) {
LAB_001300fa:
            if ((*(uint *)((long)local_110.tet + lVar18 * 4) >> ((byte)local_110.ver & 3) & 4) == 0)
            {
              uVar21 = *(ulong *)(*(long *)(pcVar3 + lVar13) +
                                 (ulong)(*(uint *)(pcVar3 + lVar13 + 8) & 3) * 8);
              pppdVar10 = (tetrahedron *)(uVar21 & 0xfffffffffffffff0);
              iVar7 = fsymtbl[*(int *)(pcVar3 + lVar13 + 8)][(uint)uVar21 & 0xf];
              local_100.tet = pppdVar10;
              goto LAB_00130143;
            }
            break;
          }
          if (ppdVar20 == (tetrahedron)this->dummypoint) {
            terminatetetgen(this,2);
            lVar18 = (long)this->elemmarkerindex;
            goto LAB_001300fa;
          }
          pppdVar10 = local_110.tet + (local_110.ver & 3);
          local_110.tet = (tetrahedron *)((ulong)*pppdVar10 & 0xfffffffffffffff0);
          local_110.ver = fsymtbl[local_110.ver][(uint)*pppdVar10 & 0xf];
        } while ((*(byte *)((long)local_110.tet + lVar18 * 4) & 2) != 0);
        goto LAB_00130329;
      }
      lVar24 = lVar24 + 1;
    }
    if (bVar14) {
      if (2 < this->b->verbose) {
        printf("      Found %ld middle subfaces.\n");
      }
      newsh.sh = (shellface *)0x0;
      newsh.shver = 0;
      local_80.sh = (shellface *)0x0;
      local_80.shver = 0;
      lVar24 = *(long *)*local_a8->toparray;
      for (lVar13 = 0; lVar18 = midfaces->objects, lVar13 < lVar18; lVar13 = lVar13 + 1) {
        pcVar3 = midfaces->toparray[(uint)lVar13 >> ((byte)midfaces->log2objectsperblock & 0x1f)];
        lVar26 = (long)midfaces->objectbytes *
                 (long)(int)(midfaces->objectsperblockmark & (uint)lVar13);
        t = (triface *)(pcVar3 + lVar26);
        unmarkface(this,t);
        makeshellface(this,this->subfaces,&newsh);
        iVar7 = *(int *)(pcVar3 + lVar26 + 8);
        lVar18 = (long)newsh.shver;
        newsh.sh[sorgpivot[lVar18]] =
             *(shellface *)(*(long *)(pcVar3 + lVar26) + (long)orgpivot[iVar7] * 8);
        newsh.sh[sdestpivot[lVar18]] =
             *(shellface *)(*(long *)(pcVar3 + lVar26) + (long)destpivot[iVar7] * 8);
        newsh.sh[sapexpivot[lVar18]] =
             *(shellface *)(*(long *)(pcVar3 + lVar26) + (long)apexpivot[iVar7] * 8);
        *(undefined4 *)((long)newsh.sh + (long)this->shmarkindex * 4) =
             *(undefined4 *)(lVar24 + (long)this->shmarkindex * 4);
        if (this->checkconstraints != 0) {
          newsh.sh[this->areaboundindex] = *(shellface *)(lVar24 + (long)this->areaboundindex * 8);
        }
        if (this->useinsertradius != 0) {
          *(undefined4 *)((long)newsh.sh + (long)this->shmarkindex * 4 + 8) =
               *(undefined4 *)(lVar24 + 8 + (long)this->shmarkindex * 4);
        }
        tsbond(this,t,&newsh);
        local_b8.tet = (tetrahedron *)((ulong)t->tet[t->ver & 3] & 0xfffffffffffffff0);
        local_b8.ver = fsymtbl[t->ver][(uint)t->tet[t->ver & 3] & 0xf];
        newsh.shver = newsh.shver ^ 1;
        tsbond(this,&local_b8,&newsh);
      }
      for (local_88 = 0; local_88 < lVar18; local_88 = local_88 + 1) {
        paVar23 = (arraypool *)
                  (midfaces->toparray
                   [(uint)local_88 >> ((byte)midfaces->log2objectsperblock & 0x1f)] +
                  (long)midfaces->objectbytes *
                  (long)(int)(midfaces->objectsperblockmark & (uint)local_88));
        local_a0 = paVar23;
        for (iVar7 = 0; iVar7 != 3; iVar7 = iVar7 + 1) {
          tspivot(this,(triface *)paVar23,&newsh);
          if (newsh.sh[newsh.shver >> 1] < (shellface)0x8) {
            fnext(this,(triface *)paVar23,&local_c8);
LAB_001306f4:
            if (local_c8.tet[8] == (tetrahedron)0x0) {
LAB_00130714:
              tspivot(this,&local_c8,&local_80);
              if (local_80.sh == (shellface *)0x0) goto code_r0x0013072f;
              newsh.sh[newsh.shver >> 1] = (shellface)((ulong)local_80.sh | (long)local_80.shver);
              local_80.sh[local_80.shver >> 1] = (shellface)((long)newsh.shver | (ulong)newsh.sh);
              paVar23 = local_a0;
            }
            else {
              uVar21 = (ulong)local_c8.ver;
              ppdVar9 = (shellface)((ulong)local_c8.tet[8][ver2edge[uVar21]] & 0xfffffffffffffff8);
              if (ppdVar9 == (shellface)0x0) goto LAB_00130714;
              uVar15 = (uint)*ppdVar9 & 7;
              pppdVar12 = (shellface *)((ulong)*ppdVar9 & 0xfffffffffffffff8);
              pppdVar10 = local_c8.tet;
              if ((*(byte *)((long)ppdVar9 + (long)this->shmarkindex * 4 + 4) & 1) == 0) {
                uVar21 = (ulong)(uVar15 >> 1);
              }
              else {
                do {
                  iVar19 = (int)uVar21;
                  if (pppdVar10[8] != (tetrahedron)0x0) {
                    pppdVar10[8][ver2edge[iVar19]] = (double *)0x0;
                  }
                  pppdVar1 = pppdVar10 + facepivot1[iVar19];
                  pppdVar10 = (tetrahedron *)((ulong)*pppdVar1 & 0xfffffffffffffff0);
                  uVar21 = (ulong)(uint)facepivot2[iVar19][(uint)*pppdVar1 & 0xf];
                } while (local_c8.tet != pppdVar10);
                pmVar4 = this->subsegs;
                ppdVar9[3] = (double *)0x0;
                *ppdVar9 = (double *)pmVar4->deaditemstack;
                pmVar4->deaditemstack = ppdVar9;
                pmVar4->items = pmVar4->items + -1;
                uVar21 = (ulong)(uVar15 >> 1);
                pppdVar12[uVar21 + 6] = (shellface)0x0;
                ppdVar9 = (shellface)0x0;
              }
              ppdVar5 = pppdVar12[uVar21];
              pppdVar22 = (shellface *)((ulong)ppdVar5 & 0xfffffffffffffff8);
              if (pppdVar22 != (shellface *)0x0) {
                uVar16 = (uint)ppdVar5 & 7;
                uVar15 = newsh.shver;
                if (ppdVar9 != (shellface)0x0) {
                  local_80.sh = pppdVar22;
                  local_80.shver = uVar16;
                  if (newsh.sh[sorgpivot[newsh.shver]] != (shellface)ppdVar9[sorgpivot[0]]) {
                    uVar15 = newsh.shver ^ 1;
                    newsh.shver = uVar15;
                  }
                  do {
                    uVar16 = local_80.shver;
                    pppdVar22 = local_80.sh;
                    local_80.shver = (uint)pppdVar22[uVar16 >> 1] & 7;
                    local_80.sh = (shellface *)((ulong)pppdVar22[uVar16 >> 1] & 0xfffffffffffffff8);
                  } while (local_80.sh != pppdVar12);
                }
                newsh.sh[(int)uVar15 >> 1] = ppdVar5;
                pppdVar22[uVar16 >> 1] = (shellface)((long)(int)uVar15 | (ulong)newsh.sh);
              }
              paVar23 = local_a0;
              if (ppdVar9 != (shellface)0x0) {
                newsh.sh[(long)(newsh.shver >> 1) + 6] = ppdVar9;
                *ppdVar9 = (double *)((long)newsh.shver | (ulong)newsh.sh);
              }
            }
          }
          ((triface *)paVar23)->ver = enexttbl[((triface *)paVar23)->ver];
        }
        lVar18 = midfaces->objects;
      }
      lVar13 = 0;
      lVar24 = local_a8->objects;
      if (local_a8->objects < 1) {
        lVar24 = lVar13;
      }
      for (; paVar23 = local_98, paVar27 = local_90, lVar24 != lVar13; lVar13 = lVar13 + 1) {
        pmVar4 = this->subfaces;
        puVar6 = *(undefined8 **)
                  (local_a8->toparray[(uint)lVar13 >> ((byte)local_a8->log2objectsperblock & 0x1f)]
                  + (long)local_a8->objectbytes *
                    (long)(int)(local_a8->objectsperblockmark & (uint)lVar13));
        puVar6[3] = 0;
        *puVar6 = pmVar4->deaditemstack;
        pmVar4->deaditemstack = puVar6;
        pmVar4->items = pmVar4->items + -1;
      }
    }
    else if (local_110.tet != (tetrahedron *)0x0) {
      for (lVar24 = 1; lVar24 < local_a8->objects; lVar24 = lVar24 + 1) {
        lVar13 = (long)local_a8->objectbytes *
                 (long)(int)(local_a8->objectsperblockmark & (uint)lVar24);
        pppdVar12 = *(shellface **)
                     (local_a8->toparray
                      [(uint)lVar24 >> ((byte)local_a8->log2objectsperblock & 0x1f)] + lVar13);
        iVar7 = *(int *)(local_a8->toparray
                         [(uint)lVar24 >> ((byte)local_a8->log2objectsperblock & 0x1f)] + lVar13 + 8
                        );
        ppdVar9 = pppdVar12[sorgpivot[iVar7]];
        if ((((ppdVar9 == local_110.tet[orgpivot[local_110.ver]]) &&
             (pppdVar12[sdestpivot[iVar7]] == local_110.tet[destpivot[local_110.ver]])) ||
            (((ppdVar9 == local_110.tet[destpivot[local_110.ver]] &&
              (pppdVar12[sdestpivot[iVar7]] == local_110.tet[orgpivot[local_110.ver]])) ||
             ((ppdVar9 == local_100.tet[orgpivot[local_100.ver]] &&
              (pppdVar12[sdestpivot[iVar7]] == local_100.tet[destpivot[local_100.ver]])))))) ||
           ((ppdVar9 == local_100.tet[destpivot[local_100.ver]] &&
            (pppdVar12[sdestpivot[iVar7]] == local_100.tet[orgpivot[local_100.ver]])))) {
          (this->recentsh).sh = pppdVar12;
          (this->recentsh).shver = iVar7;
          goto LAB_001309a2;
        }
      }
      terminatetetgen(this,2);
    }
LAB_001309a2:
    midfaces->objects = 0;
    local_98 = paVar23;
    local_90 = paVar27;
  }
  for (iVar7 = 0; iVar7 != 2; iVar7 = iVar7 + 1) {
    paVar23 = local_90;
    if (iVar7 == 0) {
      paVar23 = local_98;
    }
    if (paVar23 != (arraypool *)0x0) {
      lVar24 = paVar23->objects;
      if (paVar23->objects < 1) {
        lVar24 = 0;
      }
      for (lVar13 = 0; lVar24 != lVar13; lVar13 = lVar13 + 1) {
        pmVar4 = this->subfaces;
        puVar6 = *(undefined8 **)
                  (paVar23->toparray[(uint)lVar13 >> ((byte)paVar23->log2objectsperblock & 0x1f)] +
                  (long)paVar23->objectbytes *
                  (long)(int)(paVar23->objectsperblockmark & (uint)lVar13));
        puVar6[3] = 0;
        *puVar6 = pmVar4->deaditemstack;
        pmVar4->deaditemstack = puVar6;
        pmVar4->items = pmVar4->items + -1;
      }
    }
  }
  local_98->objects = 0;
  if (local_90 != (arraypool *)0x0) {
    local_90->objects = 0;
  }
  return bVar14;
code_r0x0013072f:
  pppdVar10 = local_c8.tet + facepivot1[local_c8.ver];
  local_c8.tet = (tetrahedron *)((ulong)*pppdVar10 & 0xfffffffffffffff0);
  local_c8.ver = facepivot2[local_c8.ver][(uint)*pppdVar10 & 0xf];
  goto LAB_001306f4;
  while( true ) {
    pppdVar1 = local_100.tet + (local_100.ver & 3);
    local_100.tet = (tetrahedron *)((ulong)*pppdVar1 & 0xfffffffffffffff0);
    iVar7 = fsymtbl[local_100.ver][(uint)*pppdVar1 & 0xf];
    if (local_100.tet == pppdVar10) break;
LAB_00130143:
    local_100.ver = esymtbl[iVar7];
    if (local_100.tet[apexpivot[local_100.ver]] == ppdVar20) {
      if ((*(byte *)((long)local_100.tet + lVar18 * 4) & 2) == 0) {
        terminatetetgen(this,2);
      }
      else {
        bond(this,&local_110,&local_100);
        puVar17 = (uint *)((long)local_110.tet + (long)this->elemmarkerindex * 4);
        *puVar17 = *puVar17 | 1;
        puVar17 = (uint *)((long)local_100.tet + (long)this->elemmarkerindex * 4);
        *puVar17 = *puVar17 | 1;
        puVar17 = (uint *)((long)local_110.tet + (long)this->elemmarkerindex * 4);
        *puVar17 = *puVar17 | 4 << ((byte)local_110.ver & 3);
        arraypool::newindex(midfaces,&parytet);
        parytet->tet = local_110.tet;
        parytet->ver = local_110.ver;
      }
      goto LAB_00130329;
    }
  }
  ppdVar2 = *(tetrahedron *)
             (*(long *)(pcVar3 + lVar13) + (ulong)(*(uint *)(pcVar3 + lVar13 + 8) & 3) * 8);
  piVar11 = fsymtbl[*(int *)(pcVar3 + lVar13 + 8)] + ((uint)ppdVar2 & 0xf);
  while( true ) {
    local_100.tet = (tetrahedron *)((ulong)ppdVar2 & 0xfffffffffffffff0);
    local_100.ver = esymtbl[*piVar11];
    if ((*(byte *)((long)local_100.tet[apexpivot[local_100.ver]] +
                  (long)this->pointmarkindex * 4 + 4) & 2) != 0) break;
    ppdVar2 = local_100.tet[local_100.ver & 3];
    piVar11 = fsymtbl[local_100.ver] + ((uint)ppdVar2 & 0xf);
  }
  dVar28 = orient3d((double *)local_110.tet[destpivot[local_110.ver]],(double *)ppdVar20,
                    (double *)local_110.tet[oppopivot[local_110.ver]],
                    (double *)local_100.tet[apexpivot[local_100.ver]]);
  if (0.0 <= dVar28) {
    if (dVar28 <= 0.0) {
      terminatetetgen(this,2);
      goto LAB_00130314;
    }
    piVar11 = eprevtbl;
  }
  else {
    piVar11 = enexttbl;
  }
  local_110.ver = piVar11[local_110.ver];
  local_100.ver = piVar11[local_100.ver];
LAB_00130314:
  bVar14 = false;
LAB_00130329:
  *(int *)(pcVar3 + lVar13 + 8) = enexttbl[*(int *)(pcVar3 + lVar13 + 8)];
  uVar15 = uVar15 + 1;
  goto LAB_00130049;
}

Assistant:

bool tetgenmesh::fillcavity(arraypool* topshells, arraypool* botshells,
                            arraypool* midfaces, arraypool* missingshs,
                            arraypool* topnewtets, arraypool* botnewtets,
                            triface* crossedge)
{
  arraypool *cavshells;
  triface bdrytet, neightet, *parytet;
  triface searchtet, spintet;
  face *parysh;
  face checkseg;
  point pa, pb, pc;
  bool mflag;
  int t1ver;
  int i, j;

  // Connect newtets to tets outside the cavity.  These connections are needed
  //   for identifying the middle faces (which belong to R).
  for (j = 0; j < 2; j++) {
    cavshells = (j == 0 ? topshells : botshells);
    if (cavshells != NULL) {
      for (i = 0; i < cavshells->objects; i++) {
        // Get a temp subface.
        parysh = (face *) fastlookup(cavshells, i);
        // Get the boundary tet outside the cavity (saved in sh[0]).
        decode(parysh->sh[0], bdrytet);
        pa = org(bdrytet);
        pb = dest(bdrytet);
        pc = apex(bdrytet);
        // Get the adjacent new tet inside the cavity.
        stpivot(*parysh, neightet);
        // Mark neightet as an interior tet of this cavity.
        infect(neightet);
        // Connect the two tets (the old connections are replaced).
        bond(bdrytet, neightet); 
        tsdissolve(neightet); // Clear the pointer to tmpsh.
        // Update the point-to-tets map.
        setpoint2tet(pa, (tetrahedron) neightet.tet);
        setpoint2tet(pb, (tetrahedron) neightet.tet);
        setpoint2tet(pc, (tetrahedron) neightet.tet);
      } // i
    } // if (cavshells != NULL)
  } // j

  if (crossedge != NULL) {
    // Glue top and bottom tets at their common facet.
    triface toptet, bottet, spintet, *midface;
    point pd, pe;
    REAL ori;
    int types[2], poss[4];
    int interflag;
    int bflag;

    mflag = false;
    pd = org(*crossedge);
    pe = dest(*crossedge);

    // Search the first (middle) face in R. 
    // Since R may be non-convex, we must make sure that the face is in the
    //   interior of R.  We search a face in 'topnewtets' whose three vertices
    //   are on R and it intersects 'crossedge' in its interior. Then search
    //   a matching face in 'botnewtets'.
    for (i = 0; i < topnewtets->objects && !mflag; i++) {
      searchtet = * (triface *) fastlookup(topnewtets, i);
      for (searchtet.ver = 0; searchtet.ver < 4 && !mflag; searchtet.ver++) {
        pa = org(searchtet);
        if (pmarktested(pa)) {
          pb = dest(searchtet);
          if (pmarktested(pb)) {
            pc = apex(searchtet);
            if (pmarktested(pc)) {
              // Check if this face intersects [d,e].
              interflag = tri_edge_test(pa,pb,pc,pd,pe,NULL,1,types,poss);
              if (interflag == 2) {
                // They intersect at a single point. Found.
                toptet = searchtet;
                // The face lies in the interior of R.
                // Get the tet (in topnewtets) which lies above R.
                ori = orient3d(pa, pb, pc, pd);
                if (ori < 0) {
                  fsymself(toptet);
                  pa = org(toptet);
                  pb = dest(toptet);
                } else if (ori == 0) {
                  terminatetetgen(this, 2);
                }
                // Search the face [b,a,c] in 'botnewtets'.
                for (j = 0; j < botnewtets->objects; j++) {
                  neightet = * (triface *) fastlookup(botnewtets, j);                  
                  // Is neightet contains 'b'.
                  if ((point) neightet.tet[4] == pb) {
                    neightet.ver = 11;
                  } else if ((point) neightet.tet[5] == pb) {
                    neightet.ver = 3;
                  } else if ((point) neightet.tet[6] == pb) {
                    neightet.ver = 7;
                  } else if ((point) neightet.tet[7] == pb) {
                    neightet.ver = 0;
                  } else {
                    continue;
                  }
                  // Is the 'neightet' contains edge [b,a].
                  if (dest(neightet) == pa) {
                    // 'neightet' is just the edge.
                  } else if (apex(neightet) == pa) {
                    eprevesymself(neightet);
                  } else if (oppo(neightet) == pa) {
                    esymself(neightet);
                    enextself(neightet);
                  } else {
                    continue;
                  }
                  // Is 'neightet' the face [b,a,c]. 
                  if (apex(neightet) == pc) {
                    bottet = neightet;
                    mflag = true;
                    break;
                  }
                } // j
              } // if (interflag == 2)
            } // pc
          } // pb
        } // pa
      } // toptet.ver
    } // i

    if (mflag) {
      // Found a pair of matched faces in 'toptet' and 'bottet'.
      bond(toptet, bottet);
      // Both are interior tets.
      infect(toptet);
      infect(bottet);
      // Add this face into search list.
      markface(toptet);
      midfaces->newindex((void **) &parytet);
      *parytet = toptet;
    } else {
      // No pair of 'toptet' and 'bottet'.
      toptet.tet = NULL;
      // Randomly split an interior edge of R.
      i = randomnation(missingshs->objects - 1);
      recentsh = * (face *) fastlookup(missingshs, i);
    }

    // Find other middle faces, connect top and bottom tets.
    for (i = 0; i < midfaces->objects && mflag; i++) {
      // Get a matched middle face [a, b, c]
      midface = (triface *) fastlookup(midfaces, i);
      // Check the neighbors at the edges of this face. 
      for (j = 0; j < 3 && mflag; j++) {
        toptet = *midface;
        bflag = false;
        while (1) {
          // Go to the next face in the same tet.
          esymself(toptet);
          pc = apex(toptet);
          if (pmarktested(pc)) {
            break; // Find a subface.
          }
          if (pc == dummypoint) {
            terminatetetgen(this, 2); // Check this case.
            break; // Find a subface.
          }
          // Go to the adjacent tet.
          fsymself(toptet);
          // Do we walk outside the cavity? 
          if (!marktested(toptet)) {
            // Yes, the adjacent face is not a middle face.
            bflag = true; break; 
          }
        }
        if (!bflag) {
          if (!facemarked(toptet)) {
            fsym(*midface, bottet);
            spintet = bottet;
            while (1) {
              esymself(bottet);
              pd = apex(bottet);
              if (pd == pc) break; // Face matched.
              fsymself(bottet);
              if (bottet.tet == spintet.tet) {
                // Not found a matched bottom face.
                mflag = false;
                break;
              }
            } // while (1)
            if (mflag) {
              if (marktested(bottet)) {
                // Connect two tets together.
                bond(toptet, bottet);
                // Both are interior tets.
                infect(toptet);
                infect(bottet);
                // Add this face into list.
                markface(toptet);
                midfaces->newindex((void **) &parytet);
                *parytet = toptet;
              }
              else {
                // The 'bottet' is not inside the cavity! 
                terminatetetgen(this, 2); // Check this case
              }
            } else { // mflag == false
              // Adjust 'toptet' and 'bottet' to be the crossing edges.
              fsym(*midface, bottet);
              spintet = bottet;
              while (1) {
                esymself(bottet);
                pd = apex(bottet);
                if (pmarktested(pd)) {
                  // assert(pd != pc);
                  // Let 'toptet' be [a,b,c,#], and 'bottet' be [b,a,d,*].
                  // Adjust 'toptet' and 'bottet' to be the crossing edges.
                  // Test orient3d(b,c,#,d).
                  ori = orient3d(dest(toptet), pc, oppo(toptet), pd);
                  if (ori < 0) {
                    // Edges [a,d] and [b,c] cross each other.
                    enextself(toptet); // [b,c]
                    enextself(bottet); // [a,d]
                  } else if (ori > 0) {
                    // Edges [a,c] and [b,d] cross each other. 
                    eprevself(toptet); // [c,a]
                    eprevself(bottet); // [d,b]
                  } else {
                    // b,c,#,and d are coplanar!.
                    terminatetetgen(this, 2); //assert(0);
                  }
                  break; // Not matched
                }
                fsymself(bottet);
              }
            } // if (!mflag)
          } // if (!facemarked(toptet))
        } // if (!bflag)
        enextself(*midface);
      } // j
    } // i

    if (mflag) {
      if (b->verbose > 2) {
        printf("      Found %ld middle subfaces.\n", midfaces->objects);
      }
      face oldsh, newsh, casout, casin, neighsh;

      oldsh = * (face *) fastlookup(missingshs, 0);

      // Create new subfaces to fill the region R.
      for (i = 0; i < midfaces->objects; i++) {
        // Get a matched middle face [a, b, c]
        midface = (triface *) fastlookup(midfaces, i);
        unmarkface(*midface);
        makeshellface(subfaces, &newsh);
        setsorg(newsh, org(*midface));
        setsdest(newsh, dest(*midface));
        setsapex(newsh, apex(*midface));
        // The new subface gets its markers from the old one.
        setshellmark(newsh, shellmark(oldsh));
        if (checkconstraints) {
          setareabound(newsh, areabound(oldsh));
        }
        if (useinsertradius) {
          setfacetindex(newsh, getfacetindex(oldsh));
        }
        // Connect the new subface to adjacent tets.
        tsbond(*midface, newsh);
        fsym(*midface, neightet);
        sesymself(newsh);
        tsbond(neightet, newsh);
      }

      // Connect new subfaces together and to the bdry of R.
      // Delete faked segments.
      for (i = 0; i < midfaces->objects; i++) {
        // Get a matched middle face [a, b, c]
        midface = (triface *) fastlookup(midfaces, i);
        for (j = 0; j < 3; j++) {
          tspivot(*midface, newsh);
          spivot(newsh, casout);
          if (casout.sh == NULL) {
            // Search its neighbor.
            fnext(*midface, searchtet);
            while (1) {
              // (1) First check if this side is a bdry edge of R.
              tsspivot1(searchtet, checkseg);
              if (checkseg.sh != NULL) {
                // It's a bdry edge of R.
                // Get the old subface.
                checkseg.shver = 0;
                spivot(checkseg, oldsh);
                if (sinfected(checkseg)) {
                  // It's a faked segment. Delete it.
                  spintet = searchtet;
                  while (1) {
                    tssdissolve1(spintet);
                    fnextself(spintet);
                    if (spintet.tet == searchtet.tet) break;
                  }
                  shellfacedealloc(subsegs, checkseg.sh);
                  ssdissolve(oldsh);
                  checkseg.sh = NULL;
                }
                spivot(oldsh, casout);
                if (casout.sh != NULL) {
                  casin = casout;
                  if (checkseg.sh != NULL) {
                    // Make sure that the subface has the right ori at the 
                    //   segment.
                    checkseg.shver = 0;
                    if (sorg(newsh) != sorg(checkseg)) {
                      sesymself(newsh);
                    }
                    spivot(casin, neighsh);
                    while (neighsh.sh != oldsh.sh) {
                      casin = neighsh;
                      spivot(casin, neighsh);
                    }
                  }
                  sbond1(newsh, casout);
                  sbond1(casin, newsh);
                }
                if (checkseg.sh != NULL) {
                  ssbond(newsh, checkseg);
                }
                break;
              } // if (checkseg.sh != NULL)
              // (2) Second check if this side is an interior edge of R.
              tspivot(searchtet, neighsh);
              if (neighsh.sh != NULL) {
                // Found an adjacent subface of newsh (an interior edge).
                sbond(newsh, neighsh);
                break;
              }
              fnextself(searchtet);
            } // while (1)
          } // if (casout.sh == NULL)
          enextself(*midface);
        } // j
      } // i

      // Delete old subfaces.
      for (i = 0; i < missingshs->objects; i++) {
        parysh = (face *) fastlookup(missingshs, i);
        shellfacedealloc(subfaces, parysh->sh);
      }
    } else {
      if (toptet.tet != NULL) {
        // Faces at top and bottom are not matched. 
        // Choose a Steiner point in R.
        // Split one of the crossing edges.
        pa = org(toptet);
        pb = dest(toptet);
        pc = org(bottet);
        pd = dest(bottet);
        // Search an edge in R which is either [a,b] or [c,d].
        // Reminder:  Subfaces in this list 'missingshs', except the first
        //   one, represents an interior edge of R. 
        for (i = 1; i < missingshs->objects; i++) {
          parysh = (face *) fastlookup(missingshs, i);
          if (((sorg(*parysh) == pa) && (sdest(*parysh) == pb)) ||
              ((sorg(*parysh) == pb) && (sdest(*parysh) == pa))) break;
          if (((sorg(*parysh) == pc) && (sdest(*parysh) == pd)) ||
              ((sorg(*parysh) == pd) && (sdest(*parysh) == pc))) break;
        }
        if (i < missingshs->objects) {
          // Found. Return it.
          recentsh = *parysh;
        } else {
          terminatetetgen(this, 2); //assert(0);
        }
      }
    }

    midfaces->restart();
  } else {
    mflag = true;
  } 

  // Delete the temp subfaces.
  for (j = 0; j < 2; j++) {
    cavshells = (j == 0 ? topshells : botshells);
    if (cavshells != NULL) {
      for (i = 0; i < cavshells->objects; i++) {
        parysh = (face *) fastlookup(cavshells, i);
        shellfacedealloc(subfaces, parysh->sh);
      }
    }
  }

  topshells->restart();
  if (botshells != NULL) {
    botshells->restart();
  }

  return mflag;
}